

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::Own<kj::_::AttachmentPromiseNode<kj::Own<capnp::LocalCallContext>_>_>::dispose
          (Own<kj::_::AttachmentPromiseNode<kj::Own<capnp::LocalCallContext>_>_> *this)

{
  AttachmentPromiseNode<kj::Own<capnp::LocalCallContext>_> *this_00;
  Disposer *in_RDX;
  
  this_00 = this->ptr;
  if (this_00 != (AttachmentPromiseNode<kj::Own<capnp::LocalCallContext>_> *)0x0) {
    this->ptr = (AttachmentPromiseNode<kj::Own<capnp::LocalCallContext>_> *)0x0;
    Disposer::Dispose_<kj::_::AttachmentPromiseNode<kj::Own<capnp::LocalCallContext>_>,_true>::
    dispose((Dispose_<kj::_::AttachmentPromiseNode<kj::Own<capnp::LocalCallContext>_>,_true> *)
            this_00,(AttachmentPromiseNode<kj::Own<capnp::LocalCallContext>_> *)this->disposer,
            in_RDX);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }